

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O0

void golf_gi_init(golf_gi_t *gi,_Bool reset_lightmaps,_Bool create_uvs,float gamma,
                 int num_iterations,int num_dilates,int num_smooths,int hemisphere_size,float z_near
                 ,float z_far,int interpolation_passes,float interpolation_threshold,
                 float camera_to_surface_distance_modifier)

{
  float camera_to_surface_distance_modifier_local;
  float interpolation_threshold_local;
  float z_far_local;
  float z_near_local;
  int num_smooths_local;
  int num_dilates_local;
  int num_iterations_local;
  float gamma_local;
  _Bool create_uvs_local;
  _Bool reset_lightmaps_local;
  golf_gi_t *gi_local;
  
  gi->reset_lightmaps = reset_lightmaps;
  gi->create_uvs = create_uvs;
  gi->gamma = gamma;
  gi->num_iterations = num_iterations;
  gi->num_dilates = num_dilates;
  gi->num_smooths = num_smooths;
  gi->hemisphere_size = hemisphere_size;
  gi->z_near = z_near;
  gi->z_far = z_far;
  gi->interpolation_passes = interpolation_passes;
  gi->interpolation_threshold = interpolation_threshold;
  gi->camera_to_surface_distance_modifier = camera_to_surface_distance_modifier;
  gi->has_cur_entity = false;
  memset(&gi->entities,0,0x18);
  (gi->entities).alloc_category = "gi";
  golf_mutex_init(&gi->lock);
  gi->is_running = false;
  gi->uv_gen_progress = 0;
  gi->lm_gen_progress = 0;
  gi->lm_gen_progress_pct = 0;
  return;
}

Assistant:

void golf_gi_init(golf_gi_t *gi,
        bool reset_lightmaps, bool create_uvs, float gamma, 
        int num_iterations, int num_dilates, int num_smooths,
        int hemisphere_size, float z_near, float z_far,
        int interpolation_passes, float interpolation_threshold,
        float camera_to_surface_distance_modifier) {
    gi->reset_lightmaps = reset_lightmaps;
    gi->create_uvs = create_uvs;
    gi->gamma = gamma;
    gi->num_iterations = num_iterations;
    gi->num_dilates = num_dilates;
    gi->num_smooths = num_smooths;
    gi->hemisphere_size = hemisphere_size;
    gi->z_near = z_near;
    gi->z_far = z_far;
    gi->interpolation_passes = interpolation_passes;
    gi->interpolation_threshold = interpolation_threshold;
    gi->camera_to_surface_distance_modifier = camera_to_surface_distance_modifier;

    gi->has_cur_entity = false;
    vec_init(&gi->entities, "gi");

    golf_mutex_init(&gi->lock);
    gi->is_running = false;
    gi->uv_gen_progress = 0;
    gi->lm_gen_progress = 0;
    gi->lm_gen_progress_pct = 0;
}